

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_palloc.c
# Opt level: O0

void * ngx_palloc_large(ngx_pool_t *pool,size_t size)

{
  ngx_pool_large_t *pnVar1;
  ngx_pool_large_t *local_38;
  ngx_pool_large_t *large;
  ngx_uint_t n;
  void *p;
  size_t size_local;
  ngx_pool_t *pool_local;
  
  pool_local = (ngx_pool_t *)ngx_alloc(size,pool->log);
  if (pool_local == (ngx_pool_t *)0x0) {
    pool_local = (ngx_pool_t *)0x0;
  }
  else {
    large = (ngx_pool_large_t *)0x0;
    for (local_38 = pool->large; local_38 != (ngx_pool_large_t *)0x0; local_38 = local_38->next) {
      if (local_38->alloc == (void *)0x0) {
        local_38->alloc = pool_local;
        return pool_local;
      }
      if ((ngx_pool_large_t *)0x3 < large) break;
      large = (ngx_pool_large_t *)((long)&large->next + 1);
    }
    pnVar1 = (ngx_pool_large_t *)ngx_palloc_small(pool,0x10,1);
    if (pnVar1 == (ngx_pool_large_t *)0x0) {
      free(pool_local);
      pool_local = (ngx_pool_t *)0x0;
    }
    else {
      pnVar1->alloc = pool_local;
      pnVar1->next = pool->large;
      pool->large = pnVar1;
    }
  }
  return pool_local;
}

Assistant:

static void *
ngx_palloc_large(ngx_pool_t *pool, size_t size)
{
    void              *p;
    ngx_uint_t         n;
    ngx_pool_large_t  *large;

    p = ngx_alloc(size, pool->log);
    if (p == NULL) {
        return NULL;
    }

    n = 0;

    for (large = pool->large; large; large = large->next) {
        if (large->alloc == NULL) {
            large->alloc = p;
            return p;
        }

        if (n++ > 3) {
            break;
        }
    }

    large = ngx_palloc_small(pool, sizeof(ngx_pool_large_t), 1);
    if (large == NULL) {
        ngx_free(p);
        return NULL;
    }

    large->alloc = p;
    large->next = pool->large;
    pool->large = large;

    return p;
}